

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void applyNumericAffinity(Mem *pRec,int bTryForInt)

{
  u8 enc;
  undefined2 uVar1;
  undefined2 uVar2;
  char *z;
  ushort uVar3;
  int iVar4;
  int iVar5;
  sqlite3_int64 i;
  double rValue;
  double local_38;
  
  z = pRec->z;
  iVar5 = pRec->n;
  enc = pRec->enc;
  iVar4 = sqlite3AtoF(z,&local_38,iVar5,enc);
  if (iVar4 < 1) {
    return;
  }
  if (iVar4 == 1) {
    i = 0x7fffffffffffffff;
    if (local_38 <= -9.223372036854776e+18) {
      i = -0x8000000000000000;
    }
    else if (local_38 < 9.223372036854776e+18) {
      i = (sqlite3_int64)local_38;
    }
    iVar4 = sqlite3RealSameAsInt(local_38,i);
    if (iVar4 == 0) {
      iVar5 = sqlite3Atoi64(z,(i64 *)pRec,iVar5,enc);
      if (iVar5 != 0) goto LAB_0014f4f5;
    }
    else {
      (pRec->u).i = i;
    }
    uVar1 = pRec->flags;
    uVar3 = uVar1 | 4;
  }
  else {
LAB_0014f4f5:
    (pRec->u).r = local_38;
    uVar2 = pRec->flags;
    uVar3 = uVar2 | 8;
    pRec->flags = uVar3;
    if (bTryForInt != 0) {
      sqlite3VdbeIntegerAffinity(pRec);
      uVar3 = pRec->flags;
    }
  }
  pRec->flags = uVar3 & 0xfffd;
  return;
}

Assistant:

static void applyNumericAffinity(Mem *pRec, int bTryForInt){
  double rValue;
  u8 enc = pRec->enc;
  int rc;
  assert( (pRec->flags & (MEM_Str|MEM_Int|MEM_Real|MEM_IntReal))==MEM_Str );
  rc = sqlite3AtoF(pRec->z, &rValue, pRec->n, enc);
  if( rc<=0 ) return;
  if( rc==1 && alsoAnInt(pRec, rValue, &pRec->u.i) ){
    pRec->flags |= MEM_Int;
  }else{
    pRec->u.r = rValue;
    pRec->flags |= MEM_Real;
    if( bTryForInt ) sqlite3VdbeIntegerAffinity(pRec);
  }
  /* TEXT->NUMERIC is many->one.  Hence, it is important to invalidate the
  ** string representation after computing a numeric equivalent, because the
  ** string representation might not be the canonical representation for the
  ** numeric value.  Ticket [343634942dd54ab57b7024] 2018-01-31. */
  pRec->flags &= ~MEM_Str;
}